

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::Vector<kj::String>const&>
          (String *__return_storage_ptr__,kj *this,Vector<kj::String> *params)

{
  long lVar1;
  undefined8 uVar2;
  long local_40;
  Delimited<kj::ArrayPtr<const_kj::String>_> *local_38;
  char *local_30;
  undefined8 local_28;
  long local_20;
  undefined8 uStack_18;
  undefined8 *local_10;
  
  local_40 = *(long *)this;
  local_38 = (Delimited<kj::ArrayPtr<const_kj::String>_> *)
             ((*(long *)(this + 8) - local_40 >> 3) * -0x5555555555555555);
  local_30 = ", ";
  local_28 = 3;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = (undefined8 *)0x0;
  _::concat<kj::_::Delimited<kj::ArrayPtr<kj::String_const>>>
            (__return_storage_ptr__,(_ *)&local_40,local_38);
  uVar2 = uStack_18;
  lVar1 = local_20;
  if (local_20 != 0) {
    local_20 = 0;
    uStack_18 = 0;
    (**(code **)*local_10)(local_10,lVar1,0x10,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}